

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_utl.cc
# Opt level: O3

ASN1_ENCODING * asn1_get_enc_ptr(ASN1_VALUE **pval,ASN1_ITEM *it)

{
  void *pvVar1;
  
  if (it->itype != '\x01') {
    __assert_fail("it->itype == ASN1_ITYPE_SEQUENCE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_utl.cc"
                  ,0x51,"ASN1_ENCODING *asn1_get_enc_ptr(ASN1_VALUE **, const ASN1_ITEM *)");
  }
  if ((((pval != (ASN1_VALUE **)0x0) && (*pval != (ASN1_VALUE *)0x0)) &&
      (pvVar1 = it->funcs, pvVar1 != (void *)0x0)) && ((*(byte *)((long)pvVar1 + 8) & 2) != 0)) {
    return (ASN1_ENCODING *)(*pval + *(int *)((long)pvVar1 + 0x18));
  }
  return (ASN1_ENCODING *)0x0;
}

Assistant:

static ASN1_ENCODING *asn1_get_enc_ptr(ASN1_VALUE **pval, const ASN1_ITEM *it) {
  assert(it->itype == ASN1_ITYPE_SEQUENCE);
  const ASN1_AUX *aux;
  if (!pval || !*pval) {
    return NULL;
  }
  aux = reinterpret_cast<const ASN1_AUX *>(it->funcs);
  if (!aux || !(aux->flags & ASN1_AFLG_ENCODING)) {
    return NULL;
  }
  return reinterpret_cast<ASN1_ENCODING *>(offset2ptr(*pval, aux->enc_offset));
}